

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::BufferTestUtil::BufferCase::BufferCase
          (BufferCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar2),testCtx->m_log);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BufferCase_01e6f6d0;
  this->m_renderCtx = renderCtx;
  p_Var1 = &(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BufferCase::BufferCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description)
	: TestCase			(testCtx, name, description)
	, CallLogWrapper	(renderCtx.getFunctions(), testCtx.getLog())
	, m_renderCtx		(renderCtx)
{
}